

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O0

float __thiscall nv::Filter::sampleBox(Filter *this,float x,float scale,int samples)

{
  float extraout_XMM0_Da;
  float value;
  float p;
  int s;
  float isamples;
  float sum;
  int samples_local;
  float scale_local;
  float x_local;
  Filter *this_local;
  
  s = 0;
  for (value = 0.0; (int)value < samples; value = (float)((int)value + 1)) {
    (*this->_vptr_Filter[2])((((float)(int)value + 0.5) * (1.0 / (float)samples) + x) * scale);
    s = (int)(extraout_XMM0_Da + (float)s);
  }
  return (float)s * (1.0 / (float)samples);
}

Assistant:

float Filter::sampleBox(float x, float scale, int samples) const
{
	float sum = 0;
	float isamples = 1.0f / float(samples);

	for(int s = 0; s < samples; s++)
	{
		float p = (x + (float(s) + 0.5f) * isamples) * scale;
		float value = evaluate(p);
		sum += value;
	}
	
	return sum * isamples;
}